

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

bool ContextualCheckBlock
               (CBlock *block,BlockValidationState *state,ChainstateManager *chainman,
               CBlockIndex *pindexPrev)

{
  char *pcVar1;
  char *pcVar2;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *v;
  uint uVar3;
  pointer psVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar11;
  char *pcVar12;
  int iVar13;
  long lVar14;
  ulong nBlockTime;
  pointer psVar15;
  long in_FS_OFFSET;
  bool bVar16;
  CScript expect;
  uint local_c0;
  int local_bc;
  string local_98;
  undefined1 local_78 [32];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar10 = 0;
  local_bc = 0;
  if (pindexPrev != (CBlockIndex *)0x0) {
    local_bc = pindexPrev->nHeight + 1;
  }
  if (pindexPrev != (CBlockIndex *)0x0) {
    uVar10 = (ulong)(pindexPrev->nHeight + 1);
  }
  if ((int)uVar10 < (((chainman->m_options).chainparams)->consensus).CSVHeight) {
    nBlockTime = (ulong)(block->super_CBlockHeader).nTime;
  }
  else {
    if (pindexPrev == (CBlockIndex *)0x0) {
      __assert_fail("pindexPrev != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ,0x107a,
                    "bool ContextualCheckBlock(const CBlock &, BlockValidationState &, const ChainstateManager &, const CBlockIndex *)"
                   );
    }
    uVar10 = CBlockIndex::GetMedianTimePast(pindexPrev);
    nBlockTime = uVar10;
  }
  psVar4 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_c0 = (uint)uVar10;
  bVar7 = (byte)uVar10;
  for (psVar15 = (block->vtx).
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; bVar16 = psVar15 != psVar4, bVar16;
      psVar15 = psVar15 + 1) {
    bVar8 = IsFinalTx((psVar15->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr,local_bc,nBlockTime);
    if (!bVar8) {
      local_58._0_8_ = local_58 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"bad-txns-nonfinal","");
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"non-final transaction","")
      ;
      bVar9 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                         (string *)local_58,(string *)local_78);
      local_c0 = (uint)bVar9;
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      if ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_ !=
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_58 + 0x10)) {
        operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
      }
    }
    bVar7 = (byte)local_c0;
    if (!bVar8) break;
  }
  local_c0._0_1_ = bVar7;
  if (bVar16) goto LAB_00404f6c;
  if (pindexPrev == (CBlockIndex *)0x0) {
    iVar13 = 0;
  }
  else {
    iVar13 = pindexPrev->nHeight + 1;
  }
  v = &block->vtx;
  if ((((chainman->m_options).chainparams)->consensus).BIP34Height <= iVar13) {
    local_78._16_8_ = 0;
    local_78._24_8_ = 0;
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = 0;
    ppVar11 = &CScript::push_int64((CScript *)local_78,(long)local_bc)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,ppVar11);
    if (0x1c < (uint)local_78._28_4_) {
      free((void *)local_78._0_8_);
      local_78._0_8_ = (pointer)0x0;
    }
    lVar14 = *(long *)&((((v->
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->vin;
    uVar3 = *(uint *)(lVar14 + 0x44);
    uVar5 = uVar3 - 0x1d;
    if (uVar3 < 0x1d) {
      uVar5 = uVar3;
    }
    uVar6 = local_58._28_4_ - 0x1d;
    if ((uint)local_58._28_4_ < 0x1d) {
      uVar6 = local_58._28_4_;
    }
    if (uVar5 < uVar6) {
LAB_00404d63:
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"bad-cb-height","");
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"block height mismatch in coinbase","");
      local_c0._0_1_ =
           ValidationState<BlockValidationResult>::Invalid
                     (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                      (string *)local_78,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      bVar8 = false;
    }
    else {
      ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58;
      if (0x1c < (uint)local_58._28_4_) {
        ppVar11 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_;
      }
      bVar16 = uVar6 == 0;
      if (!bVar16) {
        if (uVar3 < 0x1d) {
          pcVar12 = (char *)(lVar14 + 0x28);
        }
        else {
          pcVar12 = *(char **)(lVar14 + 0x28);
        }
        if ((ppVar11->_union).direct[0] == *pcVar12) {
          lVar14 = 1;
          do {
            bVar16 = (int)uVar6 == lVar14;
            if (bVar16) goto LAB_00404d58;
            pcVar1 = (ppVar11->_union).direct + lVar14;
            pcVar2 = pcVar12 + lVar14;
            lVar14 = lVar14 + 1;
          } while (*pcVar1 == *pcVar2);
        }
        goto LAB_00404d63;
      }
LAB_00404d58:
      bVar8 = true;
      if (!bVar16) goto LAB_00404d63;
    }
    if (0x1c < (uint)local_58._28_4_) {
      free((void *)local_58._0_8_);
      local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
    }
    if (!bVar8) goto LAB_00404f6c;
  }
  if (pindexPrev == (CBlockIndex *)0x0) {
    iVar13 = 0;
  }
  else {
    iVar13 = pindexPrev->nHeight + 1;
  }
  bVar16 = CheckWitnessMalleation
                     (block,(((chainman->m_options).chainparams)->consensus).SegwitHeight <= iVar13,
                      state);
  if (bVar16) {
    local_58._0_8_ = &TX_NO_WITNESS;
    local_78._0_8_ = &DAT_00000050;
    local_58._8_8_ = local_78;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
              ((VectorFormatter<DefaultFormatter> *)&local_98,
               (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_58,v);
    lVar14 = local_78._0_8_ * 3;
    local_58._0_8_ = &TX_WITH_WITNESS;
    local_78._0_8_ = &DAT_00000050;
    local_58._8_8_ = local_78;
    VectorFormatter<DefaultFormatter>::
    Ser<ParamsStream<SizeComputer&,TransactionSerParams>,std::vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>>
              ((VectorFormatter<DefaultFormatter> *)&local_98,
               (ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_58,v);
    local_c0._0_1_ = 1;
    if (4000000 < (long)(local_78._0_8_ + lVar14)) {
      local_58._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_58 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"bad-blk-weight","");
      tinyformat::format<char[21]>
                ((string *)local_78,"%s : weight limit failed",(char (*) [21])"ContextualCheckBlock"
                );
      local_c0._0_1_ =
           ValidationState<BlockValidationResult>::Invalid
                     (&state->super_ValidationState<BlockValidationResult>,BLOCK_CONSENSUS,
                      (string *)local_58,(string *)local_78);
      if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      if ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58._0_8_ !=
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(local_58 + 0x10)) {
        operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
      }
    }
  }
  else {
    local_c0._0_1_ = 0;
  }
LAB_00404f6c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)((byte)local_c0 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool ContextualCheckBlock(const CBlock& block, BlockValidationState& state, const ChainstateManager& chainman, const CBlockIndex* pindexPrev)
{
    const int nHeight = pindexPrev == nullptr ? 0 : pindexPrev->nHeight + 1;

    // Enforce BIP113 (Median Time Past).
    bool enforce_locktime_median_time_past{false};
    if (DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_CSV)) {
        assert(pindexPrev != nullptr);
        enforce_locktime_median_time_past = true;
    }

    const int64_t nLockTimeCutoff{enforce_locktime_median_time_past ?
                                      pindexPrev->GetMedianTimePast() :
                                      block.GetBlockTime()};

    // Check that all transactions are finalized
    for (const auto& tx : block.vtx) {
        if (!IsFinalTx(*tx, nHeight, nLockTimeCutoff)) {
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-txns-nonfinal", "non-final transaction");
        }
    }

    // Enforce rule that the coinbase starts with serialized block height
    if (DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_HEIGHTINCB))
    {
        CScript expect = CScript() << nHeight;
        if (block.vtx[0]->vin[0].scriptSig.size() < expect.size() ||
            !std::equal(expect.begin(), expect.end(), block.vtx[0]->vin[0].scriptSig.begin())) {
            return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-cb-height", "block height mismatch in coinbase");
        }
    }

    // Validation for witness commitments.
    // * We compute the witness hash (which is the hash including witnesses) of all the block's transactions, except the
    //   coinbase (where 0x0000....0000 is used instead).
    // * The coinbase scriptWitness is a stack of a single 32-byte vector, containing a witness reserved value (unconstrained).
    // * We build a merkle tree with all those witness hashes as leaves (similar to the hashMerkleRoot in the block header).
    // * There must be at least one output whose scriptPubKey is a single 36-byte push, the first 4 bytes of which are
    //   {0xaa, 0x21, 0xa9, 0xed}, and the following 32 bytes are SHA256^2(witness root, witness reserved value). In case there are
    //   multiple, the last one is used.
    if (!CheckWitnessMalleation(block, DeploymentActiveAfter(pindexPrev, chainman, Consensus::DEPLOYMENT_SEGWIT), state)) {
        return false;
    }

    // After the coinbase witness reserved value and commitment are verified,
    // we can check if the block weight passes (before we've checked the
    // coinbase witness, it would be possible for the weight to be too
    // large by filling up the coinbase witness, which doesn't change
    // the block hash, so we couldn't mark the block as permanently
    // failed).
    if (GetBlockWeight(block) > MAX_BLOCK_WEIGHT) {
        return state.Invalid(BlockValidationResult::BLOCK_CONSENSUS, "bad-blk-weight", strprintf("%s : weight limit failed", __func__));
    }

    return true;
}